

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrapper.hpp
# Opt level: O3

void __thiscall Diligent::FileWrapper::Open(FileWrapper *this,FileOpenAttribs *OpenAttribs)

{
  LinuxFile *pLVar1;
  string msg;
  string local_38;
  
  if (this->m_pFile != (CFile *)0x0) {
    FormatString<char[30]>(&local_38,(char (*) [30])"Another file already attached");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Open",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FileWrapper.hpp"
               ,0x3e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (this->m_pFile != (CFile *)0x0) {
      BasicFileSystem::ReleaseFile(&this->m_pFile->super_BasicFile);
    }
  }
  this->m_pFile = (CFile *)0x0;
  pLVar1 = LinuxFileSystem::OpenFile(OpenAttribs);
  this->m_pFile = pLVar1;
  return;
}

Assistant:

void Open(const FileOpenAttribs& OpenAttribs)
    {
        VERIFY(!m_pFile, "Another file already attached");
        Close();
        m_pFile = FileSystem::OpenFile(OpenAttribs);
    }